

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

pair<const_void_*,_const_pybind11::detail::type_info_*>
pybind11::detail::type_caster_base<kratos::Context>::src_and_type(itype *src)

{
  bool bVar1;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar2;
  type_index local_48;
  type_info *local_40;
  type_info *tpi;
  void *vsrc;
  type_info *instance_type;
  type_info *cast_type;
  itype *src_local;
  
  instance_type = (type_info *)&kratos::Context::typeinfo;
  vsrc = (void *)0x0;
  cast_type = (type_info *)src;
  tpi = (type_info *)polymorphic_type_hook_base<kratos::Context,_void>::get(src,(type_info **)&vsrc)
  ;
  if ((vsrc != (void *)0x0) &&
     (bVar1 = same_type((type_info *)&kratos::Context::typeinfo,(type_info *)vsrc), !bVar1)) {
    std::type_index::type_index(&local_48,(type_info *)vsrc);
    local_40 = get_type_info(&local_48,false);
    if (local_40 != (type_info *)0x0) {
      std::pair<const_void_*,_const_pybind11::detail::type_info_*>::
      pair<const_void_*&,_const_pybind11::detail::type_info_*&,_true>
                ((pair<const_void_*,_const_pybind11::detail::type_info_*> *)&src_local,&tpi,
                 &local_40);
      return _src_local;
    }
    local_40 = (type_info *)0x0;
  }
  pVar2 = type_caster_generic::src_and_type
                    (cast_type,(type_info *)&kratos::Context::typeinfo,(type_info *)vsrc);
  return pVar2;
}

Assistant:

static std::pair<const void *, const type_info *> src_and_type(const itype *src) {
        auto &cast_type = typeid(itype);
        const std::type_info *instance_type = nullptr;
        const void *vsrc = polymorphic_type_hook<itype>::get(src, instance_type);
        if (instance_type && !same_type(cast_type, *instance_type)) {
            // This is a base pointer to a derived type. If the derived type is registered
            // with pybind11, we want to make the full derived object available.
            // In the typical case where itype is polymorphic, we get the correct
            // derived pointer (which may be != base pointer) by a dynamic_cast to
            // most derived type. If itype is not polymorphic, we won't get here
            // except via a user-provided specialization of polymorphic_type_hook,
            // and the user has promised that no this-pointer adjustment is
            // required in that case, so it's OK to use static_cast.
            if (const auto *tpi = get_type_info(*instance_type))
                return {vsrc, tpi};
        }
        // Otherwise we have either a nullptr, an `itype` pointer, or an unknown derived pointer, so
        // don't do a cast
        return type_caster_generic::src_and_type(src, cast_type, instance_type);
    }